

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall gl4cts::BasicUsageSimple::Cleanup(BasicUsageSimple *this)

{
  BasicUsageSimple *this_local;
  
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->counter_buffer_);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->vao_);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->vbo_);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->prog_);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0)
  ;
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteBuffers(1, &counter_buffer_);
		glDeleteVertexArrays(1, &vao_);
		glDeleteBuffers(1, &vbo_);
		glDeleteProgram(prog_);
		glUseProgram(0);

		return NO_ERROR;
	}